

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::UnitTestOptions::FilterMatchesTest
               (string *test_suite_name,string *test_name)

{
  bool bVar1;
  PositiveAndNegativeUnitTestFilter local_c0;
  
  anon_unknown_28::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (&local_c0,test_name);
  bVar1 = anon_unknown_28::PositiveAndNegativeUnitTestFilter::MatchesTest
                    (&local_c0,test_suite_name,test_name);
  anon_unknown_28::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter(&local_c0);
  return bVar1;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string& test_suite_name,
                                        const std::string& test_name) {
  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  return PositiveAndNegativeUnitTestFilter(GTEST_FLAG_GET(filter))
      .MatchesTest(test_suite_name, test_name);
}